

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O0

int gpioSetAlertFunc(uint gpio,gpioAlertFunc_t f)

{
  FILE *__stream;
  char *pcVar1;
  ulong in_RSI;
  uint in_EDI;
  uint unaff_retaddr;
  FILE *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals & 0x400) == 0)) {
    in_stack_ffffffffffffffe8 = _stderr;
    pcVar1 = myTimeStamp();
    fprintf(in_stack_ffffffffffffffe8,"%s %s: gpio=%d function=%08X\n",pcVar1,"gpioSetAlertFunc",
            (ulong)in_EDI,in_RSI & 0xffffffff);
  }
  __stream = _stderr;
  if (libInitialised == 0) {
    if ((gpioCfg.internals & 0x400) == 0) {
      pcVar1 = myTimeStamp();
      fprintf(__stream,"%s %s: pigpio uninitialised, call gpioInitialise()\n",pcVar1,
              "gpioSetAlertFunc");
    }
    iVar2 = -0x1f;
  }
  else if (in_EDI < 0x20) {
    intGpioSetAlertFunc(unaff_retaddr,(void *)CONCAT44(in_stack_fffffffffffffffc,in_EDI),
                        (int)(in_RSI >> 0x20),in_stack_ffffffffffffffe8);
    iVar2 = 0;
  }
  else {
    if ((gpioCfg.internals & 0x400) == 0) {
      pcVar1 = myTimeStamp();
      fprintf(__stream,"%s %s: bad gpio (%d)\n",pcVar1,"gpioSetAlertFunc",(ulong)in_EDI);
    }
    iVar2 = -2;
  }
  return iVar2;
}

Assistant:

int gpioSetAlertFunc(unsigned gpio, gpioAlertFunc_t f)
{
   DBG(DBG_USER, "gpio=%d function=%08X", gpio, (uint32_t)f);

   CHECK_INITED;

   if (gpio > PI_MAX_USER_GPIO)
      SOFT_ERROR(PI_BAD_USER_GPIO, "bad gpio (%d)", gpio);

   intGpioSetAlertFunc(gpio, f, 0, NULL);

   return 0;
}